

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O2

uint8_t winmd::impl::bits_needed(uint32_t value)

{
  uint8_t uVar1;
  uint uVar2;
  
  uVar1 = '\x01';
  for (uVar2 = value - 1; 1 < uVar2; uVar2 = uVar2 >> 1) {
    uVar1 = uVar1 + '\x01';
  }
  return uVar1;
}

Assistant:

constexpr uint8_t bits_needed(uint32_t value) noexcept
    {
        --value;
        uint8_t bits{ 1 };

        while (value >>= 1)
        {
            ++bits;
        }

        return bits;
    }